

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVec2 *pIVar1;
  ImGuiTabItem *pIVar2;
  ImGuiID *pIVar3;
  int *piVar4;
  ImGuiID IVar5;
  ImGuiShrinkWidthItem *pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiID IVar11;
  ImGuiID IVar12;
  ImGuiID IVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  char *__dest;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  ImGuiWindow *pIVar23;
  ulong uVar24;
  uint uVar25;
  ImGuiTabItem *pIVar26;
  ImGuiTabItem *pIVar27;
  ImGuiTabItem *pIVar28;
  ImGuiWindow *pIVar29;
  float *pfVar30;
  long lVar31;
  ImGuiWindow *unaff_R14;
  size_t size;
  uint uVar32;
  int iVar33;
  float *pfVar34;
  bool bVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  ImVec2 IVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  ImGuiTabItem item_tmp;
  ImVec4 local_78;
  ImVec2 local_60;
  char *local_58;
  float fStack_50;
  float fStack_4c;
  ImVec2 local_48;
  ImVec2 IStack_40;
  
  pIVar15 = GImGui;
  tab_bar->WantLayout = false;
  uVar32 = (tab_bar->Tabs).Size;
  uVar22 = (ulong)uVar32;
  if ((int)uVar32 < 1) {
    uVar25 = 0;
  }
  else {
    lVar19 = 0;
    uVar20 = 0;
    uVar25 = 0;
    do {
      pIVar26 = (tab_bar->Tabs).Data;
      pIVar3 = (ImGuiID *)((long)&pIVar26->ID + lVar19);
      if (*(int *)((long)&pIVar26->LastFrameVisible + lVar19) < tab_bar->PrevFrameVisible) {
        if (*pIVar3 == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        if (uVar20 != uVar25) {
          if ((int)uVar22 <= (int)uVar25) goto LAB_002fae4f;
          IVar5 = pIVar3[0];
          IVar11 = pIVar3[1];
          IVar12 = pIVar3[2];
          IVar13 = pIVar3[3];
          fVar42 = (float)pIVar3[5];
          fVar41 = (float)pIVar3[6];
          fVar40 = (float)pIVar3[7];
          piVar4 = &pIVar26[(int)uVar25].NameOffset;
          *piVar4 = pIVar3[4];
          piVar4[1] = (int)fVar42;
          piVar4[2] = (int)fVar41;
          piVar4[3] = (int)fVar40;
          pIVar26 = pIVar26 + (int)uVar25;
          pIVar26->ID = IVar5;
          pIVar26->Flags = IVar11;
          pIVar26->LastFrameVisible = IVar12;
          pIVar26->LastFrameSelected = IVar13;
        }
        uVar25 = uVar25 + 1;
      }
      uVar20 = uVar20 + 1;
      uVar32 = (tab_bar->Tabs).Size;
      uVar22 = (ulong)(int)uVar32;
      lVar19 = lVar19 + 0x20;
    } while ((long)uVar20 < (long)uVar22);
  }
  if (uVar32 != uVar25) {
    iVar17 = (tab_bar->Tabs).Capacity;
    if (iVar17 < (int)uVar25) {
      if (iVar17 == 0) {
        uVar32 = 8;
      }
      else {
        uVar32 = iVar17 / 2 + iVar17;
      }
      if ((int)uVar32 <= (int)uVar25) {
        uVar32 = uVar25;
      }
      if (iVar17 < (int)uVar32) {
        unaff_R14 = (ImGuiWindow *)MemAlloc((long)(int)uVar32 << 5);
        pIVar26 = (tab_bar->Tabs).Data;
        if (pIVar26 != (ImGuiTabItem *)0x0) {
          memcpy(unaff_R14,pIVar26,(long)(tab_bar->Tabs).Size << 5);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = (ImGuiTabItem *)unaff_R14;
        (tab_bar->Tabs).Capacity = uVar32;
      }
    }
    (tab_bar->Tabs).Size = uVar25;
  }
  fVar42 = (float)tab_bar->NextSelectedTabId;
  if (fVar42 == 0.0) {
    fVar42 = 0.0;
  }
  else {
    tab_bar->SelectedTabId = (ImGuiID)fVar42;
    tab_bar->NextSelectedTabId = 0;
  }
  fVar41 = (float)tab_bar->ReorderRequestTabId;
  if (fVar41 != 0.0) {
    uVar22 = (ulong)(tab_bar->Tabs).Size;
    bVar35 = 0 < (long)uVar22;
    if (0 < (long)uVar22) {
      unaff_R14 = (ImGuiWindow *)(tab_bar->Tabs).Data;
      bVar35 = true;
      if (*(float *)&unaff_R14->Name != fVar41) {
        pIVar23 = (ImGuiWindow *)((long)unaff_R14 + uVar22 * 0x20 + -0x20);
        uVar20 = 1;
        pIVar29 = unaff_R14;
        do {
          uVar24 = uVar20;
          unaff_R14 = pIVar23;
          if (uVar22 == uVar24) break;
          unaff_R14 = (ImGuiWindow *)&pIVar29->SizeFull;
          pIVar1 = &pIVar29->SizeFull;
          uVar20 = uVar24 + 1;
          pIVar29 = unaff_R14;
        } while (pIVar1->x != fVar41);
        bVar35 = uVar24 < uVar22;
      }
    }
    if ((bVar35) && (unaff_R14 != (ImGuiWindow *)0x0)) {
      iVar17 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)unaff_R14);
      uVar32 = tab_bar->ReorderRequestDir + iVar17;
      if ((-1 < (int)uVar32) && ((int)uVar32 < (tab_bar->Tabs).Size)) {
        pIVar27 = (tab_bar->Tabs).Data;
        local_58 = unaff_R14->Name;
        fStack_50 = (float)unaff_R14->ID;
        fStack_4c = (float)unaff_R14->Flags;
        local_48 = unaff_R14->Pos;
        IStack_40 = unaff_R14->Size;
        pIVar26 = pIVar27 + uVar32;
        pcVar21 = *(char **)pIVar26;
        iVar17 = pIVar26->LastFrameVisible;
        iVar18 = pIVar26->LastFrameSelected;
        pIVar26 = pIVar27 + uVar32;
        fVar41 = pIVar26->Offset;
        IVar39 = *(ImVec2 *)(&pIVar26->NameOffset + 2);
        (unaff_R14->Pos).x = (float)pIVar26->NameOffset;
        (unaff_R14->Pos).y = fVar41;
        unaff_R14->Size = IVar39;
        unaff_R14->Name = pcVar21;
        unaff_R14->ID = iVar17;
        unaff_R14->Flags = iVar18;
        pIVar26 = pIVar27 + uVar32;
        pIVar26->ID = (ImGuiID)SUB84(local_58,0);
        pIVar26->Flags = (ImGuiTabItemFlags)SUB84(local_58,4);
        pIVar26->LastFrameVisible = (int)fStack_50;
        pIVar26->LastFrameSelected = (int)fStack_4c;
        pIVar26 = pIVar27 + uVar32;
        pIVar26->NameOffset = (int)local_48.x;
        pIVar26->Offset = local_48.y;
        *(ImVec2 *)(&pIVar26->NameOffset + 2) = IStack_40;
        if (pIVar27[uVar32].ID == tab_bar->SelectedTabId) {
          fVar42 = (float)pIVar27[uVar32].ID;
        }
      }
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar14 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    unaff_R14 = GImGui->CurrentWindow;
    fVar41 = (GImGui->Style).FramePadding.y;
    fVar40 = GImGui->FontSize;
    IVar39 = (unaff_R14->DC).CursorPos;
    fVar38 = (tab_bar->BarRect).Min.y;
    (unaff_R14->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar41;
    (unaff_R14->DC).CursorPos.y = fVar38;
    (tab_bar->BarRect).Min.x = fVar40 + fVar41 + (tab_bar->BarRect).Min.x;
    local_58._0_4_ = (pIVar14->Style).Colors[0].x;
    local_58._4_4_ = (pIVar14->Style).Colors[0].y;
    uVar7 = (pIVar14->Style).Colors[0].z;
    uVar8 = (pIVar14->Style).Colors[0].w;
    fStack_4c = (float)uVar8 * 0.5;
    fStack_50 = (float)uVar7;
    pfVar34 = (float *)0x0;
    PushStyleColor(0,(ImVec4 *)&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar35 = BeginCombo("##v",(char *)0x0,0x40);
    PopStyleColor(2);
    if (bVar35) {
      if ((tab_bar->Tabs).Size < 1) {
        pfVar34 = (float *)0x0;
      }
      else {
        lVar31 = 0;
        lVar19 = 0;
        pfVar34 = (float *)0x0;
        do {
          pIVar26 = (tab_bar->Tabs).Data;
          iVar17 = *(int *)((long)&pIVar26->NameOffset + lVar31);
          if (((long)iVar17 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar17)) goto LAB_002fadfa;
          pfVar30 = (float *)((long)&pIVar26->ID + lVar31);
          local_78.x = 0.0;
          local_78.y = 0.0;
          bVar35 = Selectable((tab_bar->TabsNames).Buf.Data + iVar17,
                              (float)tab_bar->SelectedTabId == *pfVar30,0,(ImVec2 *)&local_78);
          if (bVar35) {
            pfVar34 = pfVar30;
          }
          lVar19 = lVar19 + 1;
          lVar31 = lVar31 + 0x20;
        } while (lVar19 < (tab_bar->Tabs).Size);
      }
      EndPopup();
    }
    (unaff_R14->DC).CursorPos = IVar39;
    if (pfVar34 != (float *)0x0) {
      fVar42 = *pfVar34;
      tab_bar->SelectedTabId = (ImGuiID)fVar42;
    }
  }
  iVar17 = (tab_bar->Tabs).Size;
  iVar18 = (pIVar15->ShrinkWidthBuffer).Capacity;
  if (iVar18 < iVar17) {
    if (iVar18 == 0) {
      iVar33 = 8;
    }
    else {
      iVar33 = iVar18 / 2 + iVar18;
    }
    if (iVar33 <= iVar17) {
      iVar33 = iVar17;
    }
    if (iVar18 < iVar33) {
      unaff_R14 = (ImGuiWindow *)MemAlloc((long)iVar33 << 3);
      pIVar6 = (pIVar15->ShrinkWidthBuffer).Data;
      if (pIVar6 != (ImGuiShrinkWidthItem *)0x0) {
        memcpy(unaff_R14,pIVar6,(long)(pIVar15->ShrinkWidthBuffer).Size << 3);
        MemFree((pIVar15->ShrinkWidthBuffer).Data);
      }
      (pIVar15->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)unaff_R14;
      (pIVar15->ShrinkWidthBuffer).Capacity = iVar33;
    }
  }
  (pIVar15->ShrinkWidthBuffer).Size = iVar17;
  uVar32 = (tab_bar->Tabs).Size;
  if ((int)uVar32 < 1) {
    bVar35 = true;
    pIVar29 = (ImGuiWindow *)0x0;
    fVar41 = 0.0;
  }
  else {
    fVar41 = 0.0;
    lVar19 = 0;
    lVar31 = 0;
    pIVar29 = (ImGuiWindow *)0x0;
    bVar35 = false;
    do {
      unaff_R14 = (ImGuiWindow *)(tab_bar->Tabs).Data;
      if (*(int *)((long)&unaff_R14->ID + lVar19) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                      ,0x1961,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      if ((pIVar29 == (ImGuiWindow *)0x0) ||
         (pIVar29->Flags < *(int *)((long)&unaff_R14->Flags + lVar19))) {
        pIVar29 = (ImGuiWindow *)((long)&unaff_R14->Name + lVar19);
      }
      if (*(ImGuiID *)((long)&unaff_R14->Name + lVar19) == tab_bar->SelectedTabId) {
        bVar35 = true;
      }
      iVar17 = *(int *)((long)&(unaff_R14->Pos).x + lVar19);
      if (((long)iVar17 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar17)) {
LAB_002fadfa:
        __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_internal.h"
                      ,0x5b3,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar39 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar17,
                               (*(uint *)((long)&unaff_R14->Name + lVar19 + 4) >> 0x14 & 1) == 0);
      fVar40 = IVar39.x;
      *(float *)((long)&(unaff_R14->Size).y + lVar19) = fVar40;
      if (lVar31 == 0) {
        fVar38 = 0.0;
      }
      else {
        fVar38 = (pIVar15->Style).ItemInnerSpacing.x;
      }
      if ((pIVar15->ShrinkWidthBuffer).Size <= lVar31) goto LAB_002fae19;
      fVar41 = fVar41 + fVar38 + fVar40;
      pIVar6 = (pIVar15->ShrinkWidthBuffer).Data;
      pIVar6[lVar31].Index = (int)lVar31;
      pIVar6[lVar31].Width = fVar40;
      lVar31 = lVar31 + 1;
      uVar32 = (tab_bar->Tabs).Size;
      lVar19 = lVar19 + 0x20;
    } while (lVar31 < (int)uVar32);
    bVar35 = !bVar35;
  }
  fVar40 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar40 = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
  fVar41 = (float)(-(uint)(fVar40 < fVar41) & (uint)(fVar41 - fVar40));
  if ((fVar41 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if (0 < (int)uVar32) {
      fVar41 = GImGui->FontSize * 20.0;
      pIVar26 = (tab_bar->Tabs).Data;
      lVar19 = 0;
      do {
        fVar40 = *(float *)((long)&pIVar26->WidthContents + lVar19);
        if (fVar41 <= fVar40) {
          fVar40 = fVar41;
        }
        *(float *)((long)&pIVar26->Width + lVar19) = fVar40;
        lVar19 = lVar19 + 0x20;
      } while ((ulong)uVar32 << 5 != lVar19);
    }
  }
  else {
    ShrinkWidths((pIVar15->ShrinkWidthBuffer).Data,(pIVar15->ShrinkWidthBuffer).Size,fVar41);
    iVar17 = (tab_bar->Tabs).Size;
    unaff_R14 = pIVar29;
    if (0 < (long)iVar17) {
      uVar32 = (pIVar15->ShrinkWidthBuffer).Size;
      uVar20 = 0;
      uVar22 = (ulong)uVar32;
      if ((int)uVar32 < 1) {
        uVar22 = uVar20;
      }
      do {
        if (uVar22 == uVar20) goto LAB_002fae19;
        pIVar6 = (pIVar15->ShrinkWidthBuffer).Data;
        iVar18 = pIVar6[uVar20].Index;
        if (iVar17 <= iVar18) goto LAB_002fae4f;
        (tab_bar->Tabs).Data[iVar18].Width = (float)(int)pIVar6[uVar20].Width;
        uVar20 = uVar20 + 1;
      } while ((long)iVar17 != uVar20);
    }
  }
  tab_bar->OffsetNextTab = 0.0;
  iVar17 = (tab_bar->Tabs).Size;
  if ((long)iVar17 < 1) {
    fVar40 = 0.0;
    fVar41 = 0.0;
  }
  else {
    pIVar26 = (tab_bar->Tabs).Data;
    fVar38 = (pIVar15->Style).ItemInnerSpacing.x;
    fVar41 = 0.0;
    lVar19 = 0;
    fVar40 = 0.0;
    do {
      *(float *)((long)&pIVar26->Offset + lVar19) = fVar40;
      if ((fVar42 == 0.0) &&
         (fVar42 = *(float *)((long)&pIVar26->ID + lVar19),
         (float)pIVar15->NavJustMovedToId != fVar42)) {
        fVar42 = 0.0;
      }
      fVar40 = fVar40 + *(float *)((long)&pIVar26->Width + lVar19) + fVar38;
      fVar41 = fVar41 + *(float *)((long)&pIVar26->WidthContents + lVar19) + fVar38;
      lVar19 = lVar19 + 0x20;
    } while ((long)iVar17 << 5 != lVar19);
  }
  fVar38 = (pIVar15->Style).ItemInnerSpacing.x;
  fVar40 = fVar40 - fVar38;
  fVar40 = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
  tab_bar->OffsetMax = fVar40;
  fVar41 = fVar41 - fVar38;
  tab_bar->OffsetMaxIdeal = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
  pIVar14 = GImGui;
  if (((1 < iVar17) &&
      (fVar41 = (tab_bar->BarRect).Min.x, (tab_bar->BarRect).Max.x - fVar41 < fVar40)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    unaff_R14 = GImGui->CurrentWindow;
    fVar43 = GImGui->FontSize + -2.0;
    fVar40 = (GImGui->Style).FramePadding.y;
    fVar37 = fVar43 + fVar43;
    fVar38 = (tab_bar->BarRect).Max.x;
    fVar44 = (unaff_R14->DC).CursorPos.x;
    bVar36 = false;
    if (((fVar41 <= fVar44) &&
        (fVar41 = (unaff_R14->DC).CursorPos.y, (tab_bar->BarRect).Min.y <= fVar41)) &&
       (fVar44 + fVar37 <= fVar38)) {
      bVar36 = fVar41 <= (tab_bar->BarRect).Max.y;
    }
    IVar39.y = fVar40 + fVar40 + GImGui->FontSize;
    IVar39.x = fVar43;
    local_60 = (unaff_R14->DC).CursorPos;
    if (!bVar36) {
      local_58._0_4_ = fVar38 + (GImGui->Style).ItemInnerSpacing.x;
      local_58._4_4_ = (tab_bar->BarRect).Max.y + 0.0;
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_58,true);
    }
    local_58._0_4_ = (pIVar14->Style).Colors[0].x;
    local_58._4_4_ = (pIVar14->Style).Colors[0].y;
    uVar9 = (pIVar14->Style).Colors[0].z;
    uVar10 = (pIVar14->Style).Colors[0].w;
    fStack_4c = (float)uVar10 * 0.5;
    fStack_50 = (float)uVar9;
    PushStyleColor(0,(ImVec4 *)&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    fVar40 = (pIVar14->IO).KeyRepeatDelay;
    fVar38 = (pIVar14->IO).KeyRepeatRate;
    (pIVar14->IO).KeyRepeatDelay = 0.25;
    (pIVar14->IO).KeyRepeatRate = 0.2;
    fVar41 = (tab_bar->BarRect).Min.y;
    (unaff_R14->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar37;
    (unaff_R14->DC).CursorPos.y = fVar41;
    bVar16 = ArrowButtonEx("##<",0,IVar39,5);
    iVar17 = -(uint)bVar16;
    fVar41 = (tab_bar->BarRect).Min.y;
    (unaff_R14->DC).CursorPos.x = fVar43 + ((tab_bar->BarRect).Max.x - fVar37);
    (unaff_R14->DC).CursorPos.y = fVar41;
    pIVar26 = (ImGuiTabItem *)0x1;
    bVar16 = ArrowButtonEx("##>",1,IVar39,5);
    if (bVar16) {
      iVar17 = 1;
    }
    PopStyleColor(2);
    (pIVar14->IO).KeyRepeatDelay = fVar40;
    (pIVar14->IO).KeyRepeatRate = fVar38;
    if (!bVar36) {
      PopClipRect();
    }
    if (iVar17 == 0) {
      pIVar26 = (ImGuiTabItem *)0x0;
    }
    else {
      IVar5 = tab_bar->SelectedTabId;
      if (IVar5 == 0) {
LAB_002faaa1:
        pIVar26 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar22 = (ulong)(tab_bar->Tabs).Size;
        bVar36 = 0 < (long)uVar22;
        if (0 < (long)uVar22) {
          pIVar26 = (tab_bar->Tabs).Data;
          bVar36 = true;
          if (pIVar26->ID != IVar5) {
            pIVar28 = pIVar26 + (uVar22 - 1);
            uVar20 = 0;
            pIVar27 = pIVar26;
            do {
              uVar24 = uVar22;
              pIVar26 = pIVar28;
              if (uVar22 - 1 == uVar20) break;
              pIVar26 = pIVar27 + 1;
              uVar24 = uVar20 + 1;
              pIVar2 = pIVar27 + 1;
              uVar20 = uVar24;
              pIVar27 = pIVar26;
            } while (pIVar2->ID != IVar5);
            bVar36 = uVar24 < uVar22;
          }
        }
        if (!bVar36) goto LAB_002faaa1;
      }
      if (pIVar26 == (ImGuiTabItem *)0x0) {
        pIVar26 = (ImGuiTabItem *)0x0;
      }
      else {
        iVar18 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar26);
        iVar17 = iVar17 + iVar18;
        if ((iVar17 < 0) || ((tab_bar->Tabs).Size <= iVar17)) {
          iVar17 = iVar18;
        }
        if ((tab_bar->Tabs).Size <= iVar17) {
LAB_002fae4f:
          pcVar21 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_002fae64:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                        ,0x4de,pcVar21);
        }
        pIVar26 = (tab_bar->Tabs).Data + iVar17;
      }
    }
    (unaff_R14->DC).CursorPos = local_60;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar37 + 1.0);
    if (pIVar26 != (ImGuiTabItem *)0x0) {
      fVar42 = (float)pIVar26->ID;
      tab_bar->SelectedTabId = (ImGuiID)fVar42;
    }
  }
  if (bVar35) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (pIVar29 != (ImGuiWindow *)0x0)) {
    fVar42 = *(float *)&pIVar29->Name;
    tab_bar->SelectedTabId = (ImGuiID)fVar42;
  }
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if (fVar42 != 0.0) {
    uVar22 = (ulong)(tab_bar->Tabs).Size;
    bVar35 = 0 < (long)uVar22;
    if (0 < (long)uVar22) {
      unaff_R14 = (ImGuiWindow *)(tab_bar->Tabs).Data;
      bVar35 = true;
      if (*(float *)&unaff_R14->Name != fVar42) {
        pIVar23 = (ImGuiWindow *)((long)unaff_R14 + uVar22 * 0x20 + -0x20);
        uVar20 = 1;
        pIVar29 = unaff_R14;
        do {
          uVar24 = uVar20;
          unaff_R14 = pIVar23;
          if (uVar22 == uVar24) break;
          unaff_R14 = (ImGuiWindow *)&pIVar29->SizeFull;
          pIVar1 = &pIVar29->SizeFull;
          uVar20 = uVar24 + 1;
          pIVar29 = unaff_R14;
        } while (pIVar1->x != fVar42);
        bVar35 = uVar24 < uVar22;
      }
    }
    if ((bVar35) && (unaff_R14 != (ImGuiWindow *)0x0)) {
      fVar42 = GImGui->FontSize;
      iVar17 = ImGuiTabBar::GetTabOrder(tab_bar,(ImGuiTabItem *)unaff_R14);
      fVar41 = (unaff_R14->Pos).y;
      fVar40 = fVar42;
      if (iVar17 < 1) {
        fVar40 = -0.0;
      }
      fVar40 = fVar41 - fVar40;
      if ((tab_bar->Tabs).Size <= iVar17 + 1) {
        fVar42 = 1.0;
      }
      fVar42 = fVar41 + (unaff_R14->Size).x + fVar42;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if ((fVar40 < tab_bar->ScrollingTarget) ||
         (fVar41 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x, fVar41 <= fVar42 - fVar40))
      {
        fVar38 = tab_bar->ScrollingAnim - fVar42;
      }
      else {
        if (fVar42 - fVar41 <= tab_bar->ScrollingTarget) goto LAB_002fac76;
        fVar38 = (fVar40 - fVar41) - tab_bar->ScrollingAnim;
        fVar40 = fVar42 - fVar41;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar38) & (uint)fVar38);
      tab_bar->ScrollingTarget = fVar40;
    }
  }
LAB_002fac76:
  fVar41 = tab_bar->OffsetMax - ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x);
  fVar42 = tab_bar->ScrollingAnim;
  if (fVar41 <= tab_bar->ScrollingAnim) {
    fVar42 = fVar41;
  }
  fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  tab_bar->ScrollingAnim = fVar42;
  fVar40 = tab_bar->ScrollingTarget;
  if (fVar41 <= tab_bar->ScrollingTarget) {
    fVar40 = fVar41;
  }
  fVar40 = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
  tab_bar->ScrollingTarget = fVar40;
  if ((fVar42 != fVar40) || (NAN(fVar42) || NAN(fVar40))) {
    fVar41 = pIVar15->FontSize;
    fVar38 = fVar41 * 70.0;
    uVar32 = -(uint)(fVar38 <= tab_bar->ScrollingSpeed);
    fVar44 = ABS(fVar40 - fVar42) / 0.3;
    fVar38 = (float)(~uVar32 & (uint)fVar38 | (uint)tab_bar->ScrollingSpeed & uVar32);
    uVar32 = -(uint)(fVar44 <= fVar38);
    fVar44 = (float)(~uVar32 & (uint)fVar44 | uVar32 & (uint)fVar38);
    tab_bar->ScrollingSpeed = fVar44;
    fVar38 = fVar40;
    if ((pIVar15->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar41 * 10.0)) {
      fVar44 = fVar44 * (pIVar15->IO).DeltaTime;
      if (fVar40 <= fVar42) {
        fVar38 = fVar42;
        if (fVar40 < fVar42) {
          fVar42 = fVar42 - fVar44;
          uVar32 = -(uint)(fVar40 <= fVar42);
          fVar38 = (float)((uint)fVar42 & uVar32 | ~uVar32 & (uint)fVar40);
        }
      }
      else {
        fVar38 = fVar44 + fVar42;
        if (fVar40 <= fVar38) {
          fVar38 = fVar40;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar38;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  if ((tab_bar->Flags & 0x100000) == 0) {
    iVar17 = (tab_bar->TabsNames).Buf.Capacity;
    if (iVar17 < 0) {
      uVar32 = iVar17 / 2 + iVar17;
      size = 0;
      if (0 < (int)uVar32) {
        size = (size_t)uVar32;
      }
      __dest = (char *)MemAlloc(size);
      pcVar21 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar21 != (char *)0x0) {
        memcpy(__dest,pcVar21,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest;
      (tab_bar->TabsNames).Buf.Capacity = (int)size;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  return;
LAB_002fae19:
  pcVar21 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_002fae64;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->WidthContents = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = (float)(int)g.ShrinkWidthBuffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->WidthContents + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}